

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void duckdb::
     VectorArgMinMaxBase<duckdb::GreaterThan,true,(duckdb::OrderType)3,duckdb::SpecializedGenericArgMinMaxState>
     ::Update<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>>
               (Vector *inputs,AggregateInputData *param_2,idx_t input_count,Vector *state_vector,
               idx_t count)

{
  char *pcVar1;
  sel_t *psVar2;
  Vector *other;
  bool bVar3;
  ulong uVar4;
  data_ptr_t pdVar5;
  long lVar6;
  idx_t count_00;
  char *pcVar7;
  ulong uVar8;
  bool bVar9;
  string_t new_value;
  string_t new_value_00;
  SelectionVector sel;
  Vector sort_key;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  Vector sliced_input;
  sel_t assign_sel [2048];
  SelectionVector local_2228;
  Vector *local_2210;
  data_ptr_t local_2208;
  LogicalType local_2200;
  undefined1 local_21e8 [32];
  data_ptr_t local_21c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_21b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2188;
  UnifiedVectorFormat local_2178;
  UnifiedVectorFormat local_2130;
  UnifiedVectorFormat local_20e8;
  Vector local_20a0;
  sel_t local_2038 [2050];
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_20e8);
  Vector::ToUnifiedFormat(inputs,count,&local_20e8);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_2130);
  Vector::ToUnifiedFormat(inputs + 1,count,&local_2130);
  local_2208 = local_2130.data;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_2178);
  Vector::ToUnifiedFormat(state_vector,count,&local_2178);
  local_2210 = inputs;
  if (count == 0) {
    count_00 = 0;
  }
  else {
    pcVar7 = (char *)0x0;
    count_00 = 0;
    uVar8 = 0;
    do {
      uVar4 = uVar8;
      if ((local_2130.sel)->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)(local_2130.sel)->sel_vector[uVar8];
      }
      if ((local_2130.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_2130.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar4 >> 6]
           >> (uVar4 & 0x3f) & 1) != 0)) {
        local_21e8._0_8_ = *(undefined8 *)(local_2208 + uVar4 * 0x10);
        local_21e8._8_8_ = *(undefined8 *)(local_2208 + uVar4 * 0x10 + 8);
        uVar4 = uVar8;
        if ((local_20e8.sel)->sel_vector != (sel_t *)0x0) {
          uVar4 = (ulong)(local_20e8.sel)->sel_vector[uVar8];
        }
        if (local_20e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar9 = true;
        }
        else {
          bVar9 = (local_20e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                   [uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0;
        }
        if (!(bool)(bVar9 ^ 1U)) {
          uVar4 = uVar8;
          if ((local_2178.sel)->sel_vector != (sel_t *)0x0) {
            uVar4 = (ulong)(local_2178.sel)->sel_vector[uVar8];
          }
          pcVar1 = *(char **)(local_2178.data + uVar4 * 8);
          pdVar5 = local_2178.data;
          if ((*pcVar1 != '\x01') ||
             (bVar3 = string_t::StringComparisonOperators::GreaterThan
                                ((string_t *)local_21e8,(string_t *)(pcVar1 + 0x18)), bVar3)) {
            new_value.value.pointer.ptr = (char *)pdVar5;
            new_value.value._0_8_ = local_21e8._8_8_;
            ArgMinMaxStateBase::AssignValue<duckdb::string_t>
                      ((ArgMinMaxStateBase *)(pcVar1 + 0x18),(string_t *)local_21e8._0_8_,new_value)
            ;
            pcVar1[1] = bVar9 ^ 1U;
            lVar6 = count_00 - (pcVar1 == pcVar7);
            local_2038[lVar6] = (sel_t)uVar8;
            count_00 = lVar6 + 1;
            *pcVar1 = '\x01';
            pcVar7 = pcVar1;
          }
        }
      }
      uVar8 = uVar8 + 1;
    } while (count != uVar8);
  }
  other = local_2210;
  if (count_00 != 0) {
    LogicalType::LogicalType(&local_2200,BLOB);
    Vector::Vector((Vector *)local_21e8,&local_2200,0x800);
    LogicalType::~LogicalType(&local_2200);
    local_2228.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2228.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_2228.sel_vector = local_2038;
    Vector::Vector(&local_20a0,other,&local_2228,count_00);
    CreateSortKeyHelpers::CreateSortKey
              (&local_20a0,count_00,(OrderModifiers)0x303,(Vector *)local_21e8);
    local_21c8 = local_21c8 + 8;
    uVar8 = 0;
    do {
      uVar4 = uVar8;
      if (local_2228.sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)local_2228.sel_vector[uVar8];
      }
      psVar2 = (local_2178.sel)->sel_vector;
      if (psVar2 != (sel_t *)0x0) {
        uVar4 = (ulong)psVar2[uVar4];
      }
      new_value_00.value.pointer.ptr = (char *)psVar2;
      new_value_00.value._0_8_ = *(undefined8 *)local_21c8;
      ArgMinMaxStateBase::AssignValue<duckdb::string_t>
                ((ArgMinMaxStateBase *)(*(long *)(local_2178.data + uVar4 * 8) + 8),
                 *(string_t **)(local_21c8 + -8),new_value_00);
      uVar8 = uVar8 + 1;
      local_21c8 = local_21c8 + 0x10;
    } while (count_00 + (count_00 == 0) != uVar8);
    if (local_20a0.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_20a0.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_20a0.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_20a0.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_20a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_20a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_20a0.type);
    if (local_2228.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2228.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_2188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2188._M_pi);
    }
    if (local_2198._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2198._M_pi);
    }
    if (local_21b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_21b0._M_pi);
    }
    LogicalType::~LogicalType((LogicalType *)(local_21e8 + 8));
  }
  if (local_2178.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2178.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_2178.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2178.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
               .
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2130.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2130.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_2130.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2130.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
               .
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_20e8.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20e8.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_20e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
               .
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void Update(Vector inputs[], AggregateInputData &, idx_t input_count, Vector &state_vector, idx_t count) {
		auto &arg = inputs[0];
		UnifiedVectorFormat adata;
		arg.ToUnifiedFormat(count, adata);

		using ARG_TYPE = typename STATE::ARG_TYPE;
		using BY_TYPE = typename STATE::BY_TYPE;
		auto &by = inputs[1];
		UnifiedVectorFormat bdata;
		auto extra_state = UPDATE_TYPE::CreateExtraState(count);
		UPDATE_TYPE::PrepareData(by, count, extra_state, bdata);
		const auto bys = UnifiedVectorFormat::GetData<BY_TYPE>(bdata);

		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);

		STATE *last_state = nullptr;
		sel_t assign_sel[STANDARD_VECTOR_SIZE];
		idx_t assign_count = 0;

		auto states = UnifiedVectorFormat::GetData<STATE *>(sdata);
		for (idx_t i = 0; i < count; i++) {
			const auto bidx = bdata.sel->get_index(i);
			if (!bdata.validity.RowIsValid(bidx)) {
				continue;
			}
			const auto bval = bys[bidx];

			const auto aidx = adata.sel->get_index(i);
			const auto arg_null = !adata.validity.RowIsValid(aidx);
			if (IGNORE_NULL && arg_null) {
				continue;
			}

			const auto sidx = sdata.sel->get_index(i);
			auto &state = *states[sidx];
			if (!state.is_initialized || COMPARATOR::template Operation<BY_TYPE>(bval, state.value)) {
				STATE::template AssignValue<BY_TYPE>(state.value, bval);
				state.arg_null = arg_null;
				// micro-adaptivity: it is common we overwrite the same state repeatedly
				// e.g. when running arg_max(val, ts) and ts is sorted in ascending order
				// this check essentially says:
				// "if we are overriding the same state as the last row, the last write was pointless"
				// hence we skip the last write altogether
				if (!arg_null) {
					if (&state == last_state) {
						assign_count--;
					}
					assign_sel[assign_count++] = UnsafeNumericCast<sel_t>(i);
					last_state = &state;
				}
				state.is_initialized = true;
			}
		}
		if (assign_count == 0) {
			// no need to assign anything: nothing left to do
			return;
		}
		Vector sort_key(LogicalType::BLOB);
		auto modifiers = OrderModifiers(ORDER_TYPE, OrderByNullType::NULLS_LAST);
		// slice with a selection vector and generate sort keys
		SelectionVector sel(assign_sel);
		Vector sliced_input(arg, sel, assign_count);
		CreateSortKeyHelpers::CreateSortKey(sliced_input, assign_count, modifiers, sort_key);
		auto sort_key_data = FlatVector::GetData<string_t>(sort_key);

		// now assign sort keys
		for (idx_t i = 0; i < assign_count; i++) {
			const auto sidx = sdata.sel->get_index(sel.get_index(i));
			auto &state = *states[sidx];
			STATE::template AssignValue<ARG_TYPE>(state.arg, sort_key_data[i]);
		}
	}